

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::SetBlendFactors(DeviceContextVkImpl *this,float *pBlendFactors)

{
  bool bVar1;
  char (*in_RCX) [32];
  string msg;
  string local_30;
  
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::SetBlendFactors
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBlendFactors,0);
  if (bVar1) {
    EnsureVkCmdBuffer(this);
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_30,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"SetBlendConstants",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x1c9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    (*vkCmdSetBlendConstants)
              ((this->m_CommandBuffer).m_VkCmdBuffer,
               (float *)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_BlendFactors);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetBlendFactors(const float* pBlendFactors)
{
    if (TDeviceContextBase::SetBlendFactors(pBlendFactors, 0))
    {
        EnsureVkCmdBuffer();
        m_CommandBuffer.SetBlendConstants(m_BlendFactors);
    }
}